

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

void hashmap_clear(hashmap *map,_Bool update_cap)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *new_buckets;
  _Bool update_cap_local;
  hashmap *map_local;
  
  map->count = 0;
  free_elements(map);
  if (update_cap) {
    map->cap = map->nbuckets;
  }
  else if (map->nbuckets != map->cap) {
    pvVar2 = (*map->malloc)(map->bucketsz * map->cap);
    if (pvVar2 != (void *)0x0) {
      (*map->free)(map->buckets);
      map->buckets = pvVar2;
    }
    map->nbuckets = map->cap;
  }
  memset(map->buckets,0,map->bucketsz * map->nbuckets);
  map->mask = map->nbuckets - 1;
  sVar1 = map->nbuckets;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) *
          ((double)map->loadfactor / 100.0);
  uVar3 = (ulong)dVar4;
  map->growat = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
  sVar1 = map->nbuckets;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  dVar4 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.1;
  uVar3 = (ulong)dVar4;
  map->shrinkat = uVar3 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
  return;
}

Assistant:

void hashmap_clear(struct hashmap *map, bool update_cap) {
    map->count = 0;
    free_elements(map);
    if (update_cap) {
        map->cap = map->nbuckets;
    } else if (map->nbuckets != map->cap) {
        void *new_buckets = map->malloc(map->bucketsz*map->cap);
        if (new_buckets) {
            map->free(map->buckets);
            map->buckets = new_buckets;
        }
        map->nbuckets = map->cap;
    }
    memset(map->buckets, 0, map->bucketsz*map->nbuckets);
    map->mask = map->nbuckets-1;
    map->growat = map->nbuckets * (map->loadfactor / 100.0) ;
    map->shrinkat = map->nbuckets * SHRINK_AT;
}